

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscCompiler.cpp
# Opt level: O1

void __thiscall
NscCompiler::NscCompiler
          (NscCompiler *this,ResourceManager *ResMan,bool EnableExtensions,bool SaveSymbolTable)

{
  _Rb_tree_header *p_Var1;
  NscCompilerState *pNVar2;
  long lVar3;
  
  CNwnLoader::CNwnLoader(&this->super_CNwnLoader);
  (this->super_CNwnLoader)._vptr_CNwnLoader = (_func_int **)&PTR_LoadResource_00193cf0;
  this->m_ResourceManager = ResMan;
  this->m_StrictModeEnabled = false;
  this->m_EnableExtensions = EnableExtensions;
  this->m_ShowIncludes = false;
  this->m_GenerateMakeDeps = false;
  this->m_SuppressWarnings = false;
  this->m_ShowPreprocessed = false;
  this->m_ShowPreprocessed = false;
  this->m_Initialized = false;
  this->m_NWScriptParsed = false;
  this->m_SymbolTableReady = false;
  pNVar2 = (NscCompilerState *)operator_new(0x958);
  (pNVar2->m_sNscReservedWords).m_pauchData = (uchar *)0x0;
  (pNVar2->m_sNscReservedWords).m_nSize = 0;
  (pNVar2->m_sNscReservedWords).m_nAllocated = 0;
  (pNVar2->m_sNscReservedWords).m_nGrowSize = 0x400;
  memset(&(pNVar2->m_sNscReservedWords).m_nGlobalIdentifierCount,0,0x244);
  (pNVar2->m_anNscActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar2->m_anNscActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar2->m_anNscActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar2->m_sNscNWScript).m_pauchData = (uchar *)0x0;
  (pNVar2->m_sNscNWScript).m_nSize = 0;
  (pNVar2->m_sNscNWScript).m_nAllocated = 0;
  (pNVar2->m_sNscNWScript).m_nGrowSize = 0x40000;
  memset(&(pNVar2->m_sNscNWScript).m_nGlobalIdentifierCount,0,600);
  (pNVar2->m_sNscLast).m_nGrowSize = 0x40000;
  memset(&(pNVar2->m_sNscLast).m_nGlobalIdentifierCount,0,0x248);
  lVar3 = 0x758;
  do {
    *(long *)((long)(pNVar2->m_sNscReservedWords).m_sFence.anHashStart + lVar3 + -0x70) =
         (long)(pNVar2->m_sNscReservedWords).m_sFence.anHashStart + lVar3 + -0x60;
    *(undefined8 *)((long)(pNVar2->m_sNscReservedWords).m_sFence.anHashStart + lVar3 + -0x68) = 0;
    *(undefined1 *)((long)(pNVar2->m_sNscReservedWords).m_sFence.anHashStart + lVar3 + -0x60) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x958);
  pNVar2->m_pszErrorPrefix = "Error";
  pNVar2->m_fEnableExtensions = false;
  pNVar2->m_fSaveSymbolTable = false;
  pNVar2->m_SuppressWarnings = false;
  this->m_CompilerState = pNVar2;
  (this->m_IncludePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_IncludePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_IncludePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ResLoadContext = (void *)0x0;
  this->m_ResLoadFile = (ResLoadFileProc)0x0;
  this->m_ResUnloadFile = (ResUnloadFileProc)0x0;
  this->m_CacheResources = true;
  p_Var1 = &(this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ErrorOutput = (IDebugTextOut *)0x0;
  pNVar2->m_fSaveSymbolTable = SaveSymbolTable;
  return;
}

Assistant:

NscCompiler::NscCompiler (
	 ResourceManager & ResMan,
	 bool EnableExtensions,
	 bool SaveSymbolTable
	)
: m_ResourceManager (ResMan),
  m_EnableExtensions (EnableExtensions),
  m_ShowIncludes (false),
  m_ShowPreprocessed(false),
  m_GenerateMakeDeps(false),
  m_StrictModeEnabled(false),
  m_SuppressWarnings(false),
  m_Initialized (false),
  m_NWScriptParsed (false),
  m_SymbolTableReady (false),
  m_CompilerState (new NscCompilerState ()),
  m_ResLoadContext (NULL),
  m_ResLoadFile (NULL),
  m_ResUnloadFile (NULL),
  m_CacheResources (true),
  m_ErrorOutput (NULL)
{
	m_CompilerState ->m_fSaveSymbolTable = SaveSymbolTable;
}